

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

float_t __thiscall djb::beckmann::sigma_std_radial(beckmann *this,float_t zi)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float local_1c;
  float local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  if ((zi == 1.0) && (!NAN(zi))) {
    return 1.0;
  }
  fVar1 = 1.0;
  if (zi * zi <= 1.0) {
    fVar1 = zi * zi;
  }
  fVar1 = 1.0 - fVar1;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
    in_XMM0_Db = 0;
    in_XMM0_Dc = 0;
    in_XMM0_Dd = 0;
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  local_18 = zi / fVar1;
  uStack_14 = in_XMM0_Db;
  uStack_10 = in_XMM0_Dc;
  uStack_c = in_XMM0_Dd;
  fVar2 = expf(-local_18 * local_18);
  local_1c = 3.1415927;
  fVar3 = inversesqrt<float>(&local_1c);
  fVar4 = erff(local_18);
  return ((fVar4 + 1.0) * zi + fVar3 * fVar2 * fVar1) * 0.5;
}

Assistant:

float_t beckmann::sigma_std_radial(float_t zi) const
{
	if (zi == 1) return 1;
	float_t z_i = sqrt(1 - sat(sqr(zi)));
	float_t nu = zi / z_i;
	float_t tmp = exp(-sqr(nu)) * inversesqrt(m_pi());
	return (zi * (1 + erf(nu)) + z_i * tmp) / 2;
}